

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

RandCaseStatementSyntax * __thiscall
slang::parsing::Parser::parseRandCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *expr;
  SourceLocation SVar3;
  StatementSyntax *statement;
  EmptyStatementSyntax *pEVar4;
  SourceLocation SVar5;
  RandCaseItemSyntax *pRVar6;
  undefined4 extraout_var;
  RandCaseStatementSyntax *pRVar7;
  Token TVar8;
  Token randCase;
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> itemBuffer;
  Token local_108;
  SyntaxKind local_f8;
  size_type local_f0;
  pointer local_e8;
  size_type local_e0;
  Info *local_d8;
  undefined8 local_d0;
  NamedLabelSyntax *local_c8;
  pointer local_c0;
  size_type local_b8;
  SmallVectorBase<slang::syntax::RandCaseItemSyntax_*> local_b0 [2];
  Token local_70;
  SyntaxList<slang::syntax::RandCaseItemSyntax> local_60;
  
  local_b8 = attributes.size_;
  local_c0 = attributes.data_;
  local_c8 = label;
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_b0[0].data_ = (pointer)local_b0[0].firstElement;
  local_b0[0].len = 0;
  local_b0[0].cap = 5;
  while( true ) {
    local_d8 = TVar8.info;
    local_d0 = TVar8._0_8_;
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar8.kind);
    if (!bVar1) break;
    expr = parseExpression(this);
    TVar8 = ParserBase::expect(&this->super_ParserBase,Colon);
    local_108 = ParserBase::peek(&this->super_ParserBase);
    SVar3 = Token::location(&local_108);
    statement = parseStatement(this,true,false);
    if ((statement->super_SyntaxNode).kind == EmptyStatement) {
      pEVar4 = slang::syntax::SyntaxNode::as<slang::syntax::EmptyStatementSyntax>
                         (&statement->super_SyntaxNode);
      if (((pEVar4->semicolon).field_0x2 & 1) != 0) {
        local_108 = ParserBase::peek(&this->super_ParserBase);
        SVar5 = Token::location(&local_108);
        if (SVar3 == SVar5) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
    }
    pRVar6 = slang::syntax::SyntaxFactory::randCaseItem(&this->factory,expr,TVar8,statement);
    local_108._0_8_ = pRVar6;
    SmallVectorBase<slang::syntax::RandCaseItemSyntax*>::
    emplace_back<slang::syntax::RandCaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::RandCaseItemSyntax*> *)local_b0,
               (RandCaseItemSyntax **)&local_108);
    TVar8.info = local_d8;
    TVar8.kind = (undefined2)local_d0;
    TVar8._2_1_ = local_d0._2_1_;
    TVar8.numFlags.raw = local_d0._3_1_;
    TVar8.rawLen = local_d0._4_4_;
  }
  TVar8 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
  local_f8 = SyntaxList;
  local_f0 = local_b8;
  local_e8 = local_c0;
  local_e0 = local_b8;
  local_108 = (Token)ZEXT816(0x508348);
  iVar2 = SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::copy
                    (local_b0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                     (EVP_PKEY_CTX *)TVar8.info);
  local_60.super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.data_ =
       (pointer)CONCAT44(extraout_var,iVar2);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050ba60;
  randCase.info = local_d8;
  randCase.kind = (undefined2)local_d0;
  randCase._2_1_ = local_d0._2_1_;
  randCase.numFlags.raw = local_d0._3_1_;
  randCase.rawLen = local_d0._4_4_;
  local_70 = TVar8;
  pRVar7 = slang::syntax::SyntaxFactory::randCaseStatement
                     (&this->factory,local_c8,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_108,randCase,
                      &local_60,TVar8);
  if (local_b0[0].data_ != (pointer)local_b0[0].firstElement) {
    free(local_b0[0].data_);
  }
  return pRVar7;
}

Assistant:

RandCaseStatementSyntax& Parser::parseRandCaseStatement(NamedLabelSyntax* label,
                                                        AttrList attributes) {
    auto randCase = consume();
    SmallVector<RandCaseItemSyntax*> itemBuffer;

    while (isPossibleExpression(peek().kind)) {
        auto& expr = parseExpression();
        auto colon = expect(TokenKind::Colon);
        const auto loc = peek().location();
        auto& stmt = parseStatement();
        if (stmt.kind == SyntaxKind::EmptyStatement &&
            stmt.as<EmptyStatementSyntax>().semicolon.isMissing() && loc == peek().location()) {
            skipToken(std::nullopt);
        }
        itemBuffer.push_back(&factory.randCaseItem(expr, colon, stmt));
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.randCaseStatement(label, attributes, randCase, itemBuffer.copy(alloc), endcase);
}